

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O1

void TypeCheck_MethodCall(KonohaContext *kctx,KonohaStack *sfp)

{
  kNameSpace *expr;
  KClass *pKVar1;
  kToken **ppkVar2;
  kToken *pkVar3;
  KClass *c;
  _func_kNode_ptr_KonohaContext_ptr_kNode_ptr_kToken_ptr_kNameSpace_ptr_kinfotag_t_char_ptr_varargs
  *p_Var4;
  _func_uintptr_t_KonohaContext_ptr_kObject_ptr *p_Var5;
  undefined8 uVar6;
  kMethod *mtd;
  byte *pbVar7;
  KClass *pKVar8;
  kString *pkVar9;
  uintptr_t uVar10;
  uintptr_t uVar11;
  kNameSpace *pkVar12;
  long lVar13;
  kNameSpace *ns;
  kNode *local_90;
  KMethodMatch local_68;
  
  expr = (kNameSpace *)sfp[1].field_0.asNode;
  pKVar1 = *(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x58);
  pkVar12 = expr;
  do {
    ns = ((anon_union_8_4_b004c7c0_for_kNodeVar_7 *)&pkVar12->importedNameSpaceList)->StmtNameSpace;
    if ((((anon_union_8_4_b004c7c0_for_kNodeVar_7 *)&pkVar12->importedNameSpaceList)->StmtNameSpace
        ->h).ct == pKVar1) break;
    pkVar12 = ((anon_union_8_2_7d56b7f0_for_kNodeVar_3 *)&pkVar12->packageId)->RootNodeNameSpace;
    ns = pkVar12;
  } while ((pkVar12->h).ct != pKVar1);
  pKVar1 = ((sfp[3].field_0.asObject)->h).ct;
  (*(kctx->platApi->ConsoleModule).ReportDebugMessage)
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"TypeCheck_MethodCall",0x2f3,"tracing..");
  local_90 = *(kNode **)((*kctx->runtimeModels)[1].freeModel + 0xc0);
  (*kctx->klib->DumpObject)
            (kctx,(kObject_conflict *)expr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"TypeCheck_MethodCall",0x2f5);
  if (((expr->importedNameSpaceList->h).ct)->baseTypeId != 6) {
    __assert_fail("((((expr->NodeList)->h.ct)->baseTypeId) == KType_Array)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
                  ,0x2f6,"void TypeCheck_MethodCall(KonohaContext *, KonohaStack *)");
  }
  mtd = *(expr->importedNameSpaceList->field_2).MethodItems;
  if (mtd == (kMethod *)0x0) {
    __assert_fail("mtd != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
                  ,0x2f8,"void TypeCheck_MethodCall(KonohaContext *, KonohaStack *)");
  }
  if (((mtd->h).ct)->baseTypeId != 8) {
    mtd = (kMethod *)0x0;
    local_90 = (*kctx->klib->TypeCheckNodeAt)
                         (kctx,(kNode *)expr,1,ns,
                          (KClass *)
                          (((kctx->share->classTable).field_1.keyValueItems)->field_2).ObjectValue,0
                         );
    if (local_90->nodeType != 0x18) {
      ppkVar2 = (expr->importedNameSpaceList->field_2).TokenItems;
      pkVar3 = *ppkVar2;
      if ((pkVar3->h).ct != (KClass *)(*kctx->runtimeModels)[1].setupModelContext) {
        __assert_fail("(((methodToken)->h.ct) == ((KParserModel *)kctx->runtimeModels[0])->cToken)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
                      ,0x2d7,"kMethod *LookupMethod(KonohaContext *, kNode *, kNameSpace *)");
      }
      c = *(KClass **)
           ((kctx->share->classTable).field_1.bytebuf +
           (ulong)(*(uint *)((long)&ppkVar2[1]->uline + 4) & 0xfffffff) * 8);
      lVar13 = (expr->importedNameSpaceList->bytesize >> 3) - 2;
      mtd = kNameSpace_GetMethodByParamSizeNULL
                      (kctx,ns,c,pkVar3->symbol,(int)lVar13,KMethodMatch_CamelStyle);
      if ((mtd == (kMethod *)0x0) && (lVar13 == 0)) {
        pbVar7 = (byte *)(*((((pkVar3->field_2).text)->h).ct)->unbox)
                                   (kctx,(kObject_conflict *)(pkVar3->field_2).text);
        if ((pbVar7[1] == 0x6f) &&
           (((*pbVar7 | 0x20) == 0x74 &&
            (pKVar8 = (*kctx->klib->kNameSpace_GetClassByFullName)
                                (kctx,ns,(char *)(pbVar7 + 2),((pkVar3->field_2).text)->bytesize - 2
                                 ,(KClass *)0x0), pKVar8 != (KClass *)0x0)))) {
          mtd = (*kctx->klib->kNameSpace_GetCoercionMethodNULL)(kctx,ns,c,pKVar8);
        }
        else {
          mtd = (kMethod *)0x0;
        }
      }
      if (mtd == (kMethod *)0x0) {
        if ((pkVar3->field_2).text == kctx->share->emptyString) {
          mtd = (kMethod *)0x0;
        }
        else {
          local_68.ns = (kNameSpace *)0x0;
          local_68.isBreak = false;
          local_68._33_7_ = 0;
          local_68.foundMethodNULL = (kMethod *)0x0;
          local_68.paramdom = 0;
          local_68._20_4_ = 0;
          local_68.param = (kparamtype_t *)0x0;
          local_68.foundMethodListNULL = (kArray *)0x0;
          local_68.mn = 0;
          local_68.paramsize = 1;
          mtd = kNameSpace_MatchMethodNULL(kctx,ns,c,KMethodMatch_ParamSize,&local_68);
        }
        p_Var4 = kctx->klib->MessageNode;
        pkVar9 = (*kctx->klib->KClass_shortName)(kctx,c);
        p_Var5 = ((pkVar9->h).ct)->unbox;
        pkVar9 = (*kctx->klib->KClass_shortName)(kctx,c);
        uVar10 = (*p_Var5)(kctx,(kObject_conflict *)pkVar9);
        uVar6 = *(undefined8 *)(KSymbol_prefixText_prefixes + (ulong)(pkVar3->symbol >> 0x1d) * 8);
        pkVar9 = KSymbol_GetString(kctx,pkVar3->symbol);
        p_Var5 = ((pkVar9->h).ct)->unbox;
        pkVar9 = KSymbol_GetString(kctx,pkVar3->symbol);
        uVar11 = (*p_Var5)(kctx,(kObject_conflict *)pkVar9);
        (*p_Var4)(kctx,(kNode *)expr,pkVar3,ns,ErrTag,"undefined method: %s.%s%s",uVar10,uVar6,
                  uVar11);
      }
      if (mtd == (kMethod *)0x0) {
        mtd = (kMethod *)0x0;
      }
      else if ((mtd->flag & 0x80000) != 0) {
        mtd = LookupOverloadedMethod(kctx,mtd,(kNode *)expr,ns);
      }
    }
  }
  if (mtd == (kMethod *)0x0) {
    if (local_90->nodeType != 0x18) {
      sfp[-4].field_0.asNode = (kNode *)expr;
      goto LAB_00114b7f;
    }
  }
  else {
    local_90 = TypeCheckMethodParam(kctx,mtd,(kNode *)expr,ns,pKVar1);
  }
  sfp[-4].field_0.asNode = local_90;
LAB_00114b7f:
  (*kctx->klib->CheckSafePoint)(kctx,sfp,0);
  return;
}

Assistant:

static KMETHOD TypeCheck_MethodCall(KonohaContext *kctx, KonohaStack *sfp)
{
	VAR_TypeCheck(expr, ns, reqc);
	kNode *texpr = K_NULLNODE;
	KDump(expr);
	DBG_ASSERT(IS_Array(expr->NodeList));
	kMethod *mtd = expr->NodeList->MethodItems[0];
	DBG_ASSERT(mtd != NULL);
	if(!IS_Method(mtd)) {
		texpr = KLIB TypeCheckNodeAt(kctx, expr, 1, ns, KClass_INFER, 0);
		mtd = (kNode_IsError(texpr)) ? NULL : LookupMethod(kctx, expr, ns);
	}
	if(mtd != NULL) {
		texpr = TypeCheckMethodParam(kctx, mtd, expr, ns, reqc);
		KReturn(texpr);
	}
	if(kNode_IsError(texpr)) {
		KReturn(texpr);
	}
	KReturn(expr);
}